

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O2

void embree::triangle_intersect_func(RTCIntersectFunctionNArguments *args)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  void *pvVar4;
  RTCRayHitN *pRVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vfloat4 a0;
  float fVar25;
  float fVar26;
  float fVar27;
  vfloat4 a0_1;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pvVar4 = args->geometryUserPtr;
  pRVar5 = args->rayhit;
  fVar3 = (float)args->primID;
  lVar6 = *(long *)(meshes + ((ulong)pvVar4 & 0xffffffff) * 8);
  lVar7 = *(long *)(lVar6 + 8);
  lVar6 = *(long *)(lVar6 + 0x20);
  lVar8 = (ulong)(uint)fVar3 * 0xc;
  pfVar1 = (float *)(lVar7 + (long)*(int *)(lVar6 + lVar8) * 0x10);
  fVar12 = *pfVar1;
  fVar13 = pfVar1[1];
  fVar14 = pfVar1[2];
  pfVar2 = (float *)(lVar7 + (long)*(int *)(lVar6 + 4 + lVar8) * 0x10);
  fVar22 = fVar12 - *pfVar2;
  fVar23 = fVar13 - pfVar2[1];
  fVar24 = fVar14 - pfVar2[2];
  fVar25 = pfVar1[3] - pfVar2[3];
  pfVar2 = (float *)(lVar7 + (long)*(int *)(lVar6 + 8 + lVar8) * 0x10);
  fVar15 = *pfVar2 - fVar12;
  fVar16 = pfVar2[1] - fVar13;
  fVar17 = pfVar2[2] - fVar14;
  fVar18 = pfVar2[3] - pfVar1[3];
  fVar9 = fVar16 * fVar22 - fVar23 * fVar15;
  fVar10 = fVar17 * fVar23 - fVar24 * fVar16;
  fVar11 = fVar15 * fVar24 - fVar22 * fVar17;
  fVar28 = *(float *)(pRVar5 + 0x10);
  fVar26 = *(float *)(pRVar5 + 0x14);
  fVar27 = *(float *)(pRVar5 + 0x18);
  fVar12 = fVar12 - *(float *)pRVar5;
  fVar13 = fVar13 - *(float *)(pRVar5 + 4);
  fVar14 = fVar14 - *(float *)(pRVar5 + 8);
  fVar19 = fVar13 * fVar28 - fVar26 * fVar12;
  fVar20 = fVar14 * fVar26 - fVar27 * fVar13;
  fVar21 = fVar12 * fVar27 - fVar28 * fVar14;
  fVar26 = fVar26 * fVar11;
  fVar27 = fVar27 * fVar9;
  fVar18 = *(float *)(pRVar5 + 0x1c) * (fVar18 * fVar25 - fVar25 * fVar18);
  fVar25 = fVar26 + fVar28 * fVar10 + fVar27;
  fVar28 = fVar26 + fVar26 + fVar18;
  fVar27 = fVar26 + fVar27 + fVar27;
  fVar18 = fVar26 + fVar18 + fVar18;
  auVar29._4_4_ = fVar28;
  auVar29._0_4_ = fVar25;
  auVar29._8_4_ = fVar27;
  auVar29._12_4_ = fVar18;
  auVar30._4_4_ = fVar28;
  auVar30._0_4_ = fVar25;
  auVar30._8_4_ = fVar27;
  auVar30._12_4_ = fVar18;
  auVar30 = rcpss(auVar29,auVar30);
  fVar28 = (2.0 - auVar30._0_4_ * fVar25) * auVar30._0_4_;
  fVar26 = (fVar17 * fVar19 + fVar16 * fVar21 + fVar15 * fVar20) * fVar28;
  fVar27 = (fVar19 * fVar24 + fVar21 * fVar23 + fVar20 * fVar22) * fVar28;
  if ((((fVar26 + fVar27 <= 1.0) && (0.0 <= fVar27)) && ((fVar25 != 0.0 || (NAN(fVar25))))) &&
     (((0.0 <= fVar26 &&
       (fVar28 = (fVar14 * fVar9 + fVar13 * fVar11 + fVar12 * fVar10) * fVar28,
       *(float *)(pRVar5 + 0xc) < fVar28)) && (fVar28 < *(float *)(pRVar5 + 0x20))))) {
    *(float *)(pRVar5 + 0x20) = fVar28;
    *(float *)(pRVar5 + 0x3c) = fVar26;
    *(float *)(pRVar5 + 0x40) = fVar27;
    *(float *)(pRVar5 + 0x48) = SUB84(pvVar4,0);
    *(float *)(pRVar5 + 0x44) = fVar3;
    *(ulong *)(pRVar5 + 0x30) = CONCAT44(fVar11,fVar10);
    *(float *)(pRVar5 + 0x38) = fVar9;
    return;
  }
  return;
}

Assistant:

void triangle_intersect_func(const RTCIntersectFunctionNArguments* args)
{
  void* ptr  = args->geometryUserPtr;
  ::Ray* ray = (::Ray*)args->rayhit;
  unsigned int primID = args->primID;
  unsigned geomID = (unsigned) (size_t) ptr;
  auto const & mesh = *meshes[geomID];
  
  auto & v0 = mesh.x_[mesh.tris_[args->primID].v0];
  auto & v1 = mesh.x_[mesh.tris_[args->primID].v1];
  auto & v2 = mesh.x_[mesh.tris_[args->primID].v2];
  auto e1 = v0-v1;
  auto e2 = v2-v0;
  auto Ng = cross(e1,e2);

  /* calculate denominator */
  auto O = Vec3fa(ray->org);
  auto D = Vec3fa(ray->dir);
  auto C = v0 - O;
  auto R = cross(D,C);
  float den = dot(Ng,D);
  float rcpDen = rcp(den);
      
  /* perform edge tests */
  float u = dot(R,e2)*rcpDen;
  float v = dot(R,e1)*rcpDen;
          
  /* perform backface culling */        
  bool valid = (den != 0.0f) & (u >= 0.0f) & (v >= 0.0f) & (u+v<=1.0f);
  if (likely(!valid)) return;
      
  /* perform depth test */
  float t = dot(Vec3fa(Ng),C)*rcpDen;
  valid &= (t > ray->tnear()) & (t < ray->tfar);
  if (likely(!valid)) return;
  
  /* update hit */
  ray->tfar = t;
  ray->u = u;
  ray->v = v;
  ray->geomID = geomID;
  ray->primID = primID;
  ray->Ng = Ng;
}